

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Multi_field_small_shared.h
# Opt level: O2

Shared_multi_field_element_with_small_characteristics<unsigned_int,_void> __thiscall
Gudhi::persistence_fields::Shared_multi_field_element_with_small_characteristics<unsigned_int,_void>
::get_partial_multiplicative_identity
          (Shared_multi_field_element_with_small_characteristics<unsigned_int,_void> *this,
          Characteristic *productOfCharacteristics)

{
  pointer puVar1;
  pointer puVar2;
  uint uVar3;
  ulong uVar4;
  
  if (*productOfCharacteristics == 0) {
    this->element_ = (uint)(1 < productOfAllCharacteristics_);
  }
  else {
    this->element_ = 0;
    puVar1 = primes_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar2 = primes_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar3 = 0; uVar4 = (ulong)uVar3, uVar4 < (ulong)((long)puVar1 - (long)puVar2 >> 2);
        uVar3 = uVar3 + 1) {
      if (*productOfCharacteristics % puVar2[uVar4] == 0) {
        operator+=(this,partials_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start + uVar4);
        puVar1 = primes_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        puVar2 = primes_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
    }
  }
  return (Shared_multi_field_element_with_small_characteristics<unsigned_int,_void>)
         (Element_conflict)this;
}

Assistant:

static Shared_multi_field_element_with_small_characteristics get_partial_multiplicative_identity(
      const Characteristic& productOfCharacteristics) {
    if (productOfCharacteristics == 0) {
      return Shared_multi_field_element_with_small_characteristics(multiplicativeID_);
    }
    Shared_multi_field_element_with_small_characteristics mult;
    for (Characteristic idx = 0; idx < primes_.size(); ++idx) {
      if ((productOfCharacteristics % primes_[idx]) == 0) {
        mult += partials_[idx];
      }
    }
    return mult;
  }